

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http1client.c
# Opt level: O0

h2o_http1client_body_cb
on_head(h2o_http1client_t *client,char *errstr,int minor_version,int status,h2o_iovec_t msg,
       h2o_header_t *headers,size_t num_headers,int rlen)

{
  rp_generator_t *self_00;
  h2o_req_t *req_00;
  h2o_token_t *token_00;
  char cVar1;
  int iVar2;
  size_t sVar3;
  h2o_http1client_ctx_t *phVar4;
  h2o_iovec_t hVar5;
  h2o_iovec_t hVar6;
  h2o_http1client_ctx_t *client_ctx;
  h2o_iovec_t value_1;
  h2o_iovec_t name;
  char *local_c0;
  char *local_b8;
  size_t local_b0;
  h2o_iovec_t new_value;
  char *local_90;
  h2o_iovec_t method;
  h2o_iovec_t value;
  h2o_token_t *token;
  size_t local_50;
  size_t i;
  h2o_req_t *req;
  rp_generator_t *self;
  int status_local;
  int minor_version_local;
  char *errstr_local;
  h2o_http1client_t *client_local;
  h2o_iovec_t msg_local;
  
  self_00 = (rp_generator_t *)client->data;
  req_00 = self_00->src_req;
  if ((errstr == (char *)0x0) || (errstr == "end of stream")) {
    (req_00->res).status = status;
    hVar5 = h2o_strdup(&req_00->pool,msg.base,msg.len);
    token = (h2o_token_t *)hVar5.base;
    (req_00->res).reason = (char *)token;
    for (local_50 = 0; local_50 != num_headers; local_50 = local_50 + 1) {
      iVar2 = h2o_iovec_is_token(headers[local_50].name);
      if (iVar2 == 0) {
        hVar5 = h2o_strdup(&req_00->pool,(headers[local_50].name)->base,
                           (headers[local_50].name)->len);
        hVar6 = h2o_strdup(&req_00->pool,headers[local_50].value.base,headers[local_50].value.len);
        value_1.len = (size_t)hVar5.base;
        name.base = (char *)hVar5.len;
        client_ctx = (h2o_http1client_ctx_t *)hVar6.base;
        value_1.base = (char *)hVar6.len;
        h2o_add_header_by_str
                  (&req_00->pool,&(req_00->res).headers,(char *)value_1.len,(size_t)name.base,0,
                   headers[local_50].orig_name,(char *)client_ctx,(size_t)value_1.base);
      }
      else {
        token_00 = (h2o_token_t *)headers[local_50].name;
        if (((byte)token_00->field_0x11 >> 1 & 1) == 0) {
          if (token_00 == h2o__tokens + 0x14) {
            if ((req_00->res).content_length != 0xffffffffffffffff) {
LAB_00168f74:
              self_00->client = (h2o_http1client_t *)0x0;
              h2o_req_log_error(req_00,"lib/core/proxy.c","%s");
              h2o_send_error_502(req_00,"Gateway Error","invalid response from upstream",0);
              return (h2o_http1client_body_cb)0x0;
            }
            sVar3 = h2o_strtosize(headers[local_50].value.base,headers[local_50].value.len);
            (req_00->res).content_length = sVar3;
            if (sVar3 == 0xffffffffffffffff) goto LAB_00168f74;
          }
          else if (token_00 == h2o__tokens + 0x28) {
            if ((((((byte)req_00->field_0x1e8 >> 1 & 1) != 0) && (299 < status)) && (status < 400))
               && (status != 0x130)) {
              self_00->client = (h2o_http1client_t *)0x0;
              hVar5 = h2o_get_redirect_method(req_00->method,status);
              h2o_send_redirect_internal
                        (req_00,hVar5,headers[local_50].value.base,headers[local_50].value.len,1);
              return (h2o_http1client_body_cb)0x0;
            }
            if ((req_00->overrides == (h2o_req_overrides_t *)0x0) ||
               ((req_00->overrides->location_rewrite).match == (h2o_url_t *)0x0)) {
LAB_001692c8:
              hVar5 = h2o_strdup(&req_00->pool,headers[local_50].value.base,
                                 headers[local_50].value.len);
              name.len = (size_t)hVar5.base;
              method.len = name.len;
              local_c0 = (char *)hVar5.len;
              value.base = local_c0;
            }
            else {
              hVar5 = rewrite_location(&req_00->pool,headers[local_50].value.base,
                                       headers[local_50].value.len,
                                       (req_00->overrides->location_rewrite).match,
                                       (req_00->input).scheme,(req_00->input).authority,
                                       (req_00->overrides->location_rewrite).path_prefix);
              new_value.len = (size_t)hVar5.base;
              method.len = new_value.len;
              local_90 = (char *)hVar5.len;
              value.base = local_90;
              if (new_value.len == 0) goto LAB_001692c8;
            }
            h2o_add_header(&req_00->pool,&(req_00->res).headers,token_00,headers[local_50].orig_name
                           ,(char *)method.len,(size_t)value.base);
          }
          else if (token_00 == h2o__tokens + 0x27) {
            hVar5 = h2o_push_path_in_link_header
                              (req_00,headers[local_50].value.base,headers[local_50].value.len);
            local_b8 = hVar5.base;
            local_b0 = hVar5.len;
            if (local_b0 != 0) {
              headers[local_50].value.base = local_b8;
              headers[local_50].value.len = local_b0;
              goto LAB_001692c8;
            }
          }
          else if (token_00 == h2o__tokens + 0x30) {
            if (((byte)(req_00->conn->ctx->globalconf->proxy).field_0x10 >> 1 & 1) != 0)
            goto LAB_001692c8;
          }
          else {
            if (token_00 != h2o__tokens + 0x3a) goto LAB_001692c8;
            cVar1 = compress_hint_to_enum(headers[local_50].value.base,headers[local_50].value.len);
            req_00->compress_hint = cVar1;
          }
        }
      }
    }
    if ((self_00->is_websocket_handshake == 0) || ((req_00->res).status != 0x65)) {
      h2o_start_response(req_00,(h2o_generator_t *)self_00);
      if (errstr == "end of stream") {
        self_00->client = (h2o_http1client_t *)0x0;
        h2o_send(req_00,(h2o_iovec_t *)0x0,0,H2O_SEND_STATE_FINAL);
        msg_local.len = 0;
      }
      else {
        msg_local.len = (size_t)on_body;
      }
    }
    else {
      phVar4 = get_client_ctx(req_00);
      if (phVar4->websocket_timeout == (h2o_timeout_t *)0x0) {
        __assert_fail("client_ctx->websocket_timeout != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/urbit[P]h2o/lib/core/proxy.c"
                      ,0x1e8,
                      "h2o_http1client_body_cb on_head(h2o_http1client_t *, const char *, int, int, h2o_iovec_t, h2o_header_t *, size_t, int)"
                     );
      }
      h2o_add_header(&req_00->pool,&(req_00->res).headers,h2o__tokens + 0x35,(char *)0x0,"websocket"
                     ,9);
      on_websocket_upgrade(self_00,phVar4->websocket_timeout,rlen);
      self_00->client = (h2o_http1client_t *)0x0;
      msg_local.len = 0;
    }
  }
  else {
    self_00->client = (h2o_http1client_t *)0x0;
    h2o_req_log_error(req_00,"lib/core/proxy.c","%s");
    h2o_send_error_502(req_00,"Gateway Error",errstr,0);
    msg_local.len = 0;
  }
  return (h2o_http1client_body_cb)msg_local.len;
}

Assistant:

static void on_head(h2o_socket_t *sock, const char *err)
{
    struct st_h2o_http1client_private_t *client = sock->data;
    int minor_version, http_status, rlen, is_eos;
    const char *msg;
#define MAX_HEADERS 100
    h2o_header_t *headers;
    h2o_iovec_t *header_names;
    size_t msg_len, num_headers, i;
    h2o_socket_cb reader;
    h2o_mem_pool_t pool;

    h2o_timeout_unlink(&client->_timeout);

    if (err != NULL) {
        on_error_before_head(client, "I/O error (head)");
        return;
    }

    h2o_mem_init_pool(&pool);

    headers = h2o_mem_alloc_pool(&pool, sizeof(*headers) * MAX_HEADERS);
    header_names = h2o_mem_alloc_pool(&pool, sizeof(*header_names) * MAX_HEADERS);

    /* continue parsing the responses until we see a final one */
    while (1) {
        /* parse response */
        struct phr_header src_headers[MAX_HEADERS];
        num_headers = MAX_HEADERS;
        rlen = phr_parse_response(sock->input->bytes, sock->input->size, &minor_version, &http_status, &msg, &msg_len, src_headers,
                                  &num_headers, 0);
        switch (rlen) {
        case -1: /* error */
            on_error_before_head(client, "failed to parse the response");
            goto Exit;
        case -2: /* incomplete */
            h2o_timeout_link(client->super.ctx->loop, client->super.ctx->io_timeout, &client->_timeout);
            goto Exit;
        }
        /* fill-in the headers */
        for (i = 0; i != num_headers; ++i) {
            const h2o_token_t *token;
            char *orig_name = h2o_strdup(&pool, src_headers[i].name, src_headers[i].name_len).base;
            h2o_strtolower((char *)src_headers[i].name, src_headers[i].name_len);
            token = h2o_lookup_token(src_headers[i].name, src_headers[i].name_len);
            if (token != NULL) {
                headers[i].name = (h2o_iovec_t *)&token->buf;
            } else {
                header_names[i] = h2o_iovec_init(src_headers[i].name, src_headers[i].name_len);
                headers[i].name = &header_names[i];
            }
            headers[i].value = h2o_iovec_init(src_headers[i].value, src_headers[i].value_len);
            headers[i].orig_name = orig_name;
        }

        if (!(100 <= http_status && http_status <= 199 && http_status != 101))
            break;

        if (client->super.informational_cb != NULL &&
            client->super.informational_cb(&client->super, minor_version, http_status, h2o_iovec_init(msg, msg_len), headers,
                                           num_headers) != 0) {
            close_client(client);
            goto Exit;
        }
        h2o_buffer_consume(&client->super.sock->input, rlen);
        if (client->super.sock->input->size == 0) {
            h2o_timeout_link(client->super.ctx->loop, client->super.ctx->io_timeout, &client->_timeout);
            goto Exit;
        }
    }

    /* parse the headers */
    reader = on_body_until_close;
    client->_can_keepalive = minor_version >= 1;
    for (i = 0; i != num_headers; ++i) {
        if (headers[i].name == &H2O_TOKEN_CONNECTION->buf) {
            if (h2o_contains_token(headers[i].value.base, headers[i].value.len, H2O_STRLIT("keep-alive"), ',')) {
                client->_can_keepalive = 1;
            } else {
                client->_can_keepalive = 0;
            }
        } else if (headers[i].name == &H2O_TOKEN_TRANSFER_ENCODING->buf) {
            if (h2o_memis(headers[i].value.base, headers[i].value.len, H2O_STRLIT("chunked"))) {
                /* precond: _body_decoder.chunked is zero-filled */
                client->_body_decoder.chunked.decoder.consume_trailer = 1;
                reader = on_body_chunked;
            } else if (h2o_memis(headers[i].value.base, headers[i].value.len, H2O_STRLIT("identity"))) {
                /* continue */
            } else {
                on_error_before_head(client, "unexpected type of transfer-encoding");
                goto Exit;
            }
        } else if (headers[i].name == &H2O_TOKEN_CONTENT_LENGTH->buf) {
            if ((client->_body_decoder.content_length.bytesleft = h2o_strtosize(headers[i].value.base, headers[i].value.len)) ==
                SIZE_MAX) {
                on_error_before_head(client, "invalid content-length");
                goto Exit;
            }
            if (reader != on_body_chunked)
                reader = on_body_content_length;
        }
    }

    /* RFC 2616 4.4 */
    if (client->_method_is_head || http_status == 101 || http_status == 204 || http_status == 304) {
        is_eos = 1;
    } else {
        is_eos = 0;
        /* close the connection if impossible to determine the end of the response (RFC 7230 3.3.3) */
        if (reader == on_body_until_close)
            client->_can_keepalive = 0;
    }

    /* call the callback. sock may be stealed and stealed sock need rlen.*/
    client->_cb.on_body = client->_cb.on_head(&client->super, is_eos ? h2o_http1client_error_is_eos : NULL, minor_version,
                                              http_status, h2o_iovec_init(msg, msg_len), headers, num_headers, rlen);

    if (is_eos) {
        close_client(client);
        goto Exit;
    } else if (client->_cb.on_body == NULL) {
        client->_can_keepalive = 0;
        close_client(client);
        goto Exit;
    }

    h2o_buffer_consume(&client->super.sock->input, rlen);
    client->super.sock->bytes_read = client->super.sock->input->size;

    client->_timeout.cb = on_body_timeout;
    h2o_socket_read_start(sock, reader);
    reader(client->super.sock, 0);

Exit:
    h2o_mem_clear_pool(&pool);
#undef MAX_HEADERS
}